

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int read_script_token(char *buf,size_t buflen,osfildef *fp)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  do {
    iVar1 = fgetc((FILE *)buflen);
    iVar2 = isspace(iVar1);
  } while (iVar2 != 0);
  uVar3 = 0;
  while ((uVar3 < 0x1f && (iVar1 != 0x3e))) {
    iVar2 = isspace(iVar1);
    if ((iVar2 != 0) || ((iVar1 + 1U < 0xf && ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) != 0)))) break;
    buf[uVar3] = (char)iVar1;
    uVar3 = uVar3 + 1;
    iVar1 = fgetc((FILE *)buflen);
  }
  buf[uVar3] = '\0';
  return iVar1;
}

Assistant:

static int read_script_token(char *buf, size_t buflen, osfildef *fp)
{
    char *p;
    int c;

    /* skip leading whitespace */
    for (c = osfgetc(fp) ; isspace(c) ; c = osfgetc(fp)) ;

    /* read from the file until we reach the end of the token */
    for (p = buf ;
         p < buf + buflen - 1
             && c != '>' && !isspace(c)
             && c != '\n' && c != '\r' && c != EOF ; )
    {
        /* store this character */
        *p++ = (char)c;

        /* get the next one */
        c = osfgetc(fp);
    }

    /* null-terminate the token */
    *p = '\0';

    /* return the character that ended the token */
    return c;
}